

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall QPlainTextEdit::dragMoveEvent(QPlainTextEdit *this,QDragMoveEvent *e)

{
  long lVar1;
  bool bVar2;
  QPlainTextEditPrivate *this_00;
  QPoint QVar3;
  QPointF *in_RSI;
  long in_FS_OFFSET;
  QPointF QVar4;
  QPlainTextEditPrivate *d;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QPlainTextEdit *)0x6c712f);
  QVar4 = QDropEvent::position((QDropEvent *)this_00);
  QVar3 = QPointF::toPoint(in_RSI);
  this_00->autoScrollDragPos = QVar3;
  bVar2 = QBasicTimer::isActive(&this_00->autoScrollTimer);
  if (!bVar2) {
    QBasicTimer::start((QBasicTimer *)in_RSI,QVar4.yp._4_4_,(QObject *)this_00);
  }
  QPlainTextEditPrivate::sendControlEvent((QPlainTextEditPrivate *)QVar4.yp,(QEvent *)QVar4.xp);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextEdit::dragMoveEvent(QDragMoveEvent *e)
{
    Q_D(QPlainTextEdit);
    d->autoScrollDragPos = e->position().toPoint();
    if (!d->autoScrollTimer.isActive())
        d->autoScrollTimer.start(100, this);
    d->sendControlEvent(e);
}